

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
FMultiBlockLinesIterator::startIteratorForGroup(FMultiBlockLinesIterator *this,int group)

{
  sector_t *local_38;
  FDisplacementTable local_28;
  FMultiBlockLinesIterator *pFStack_10;
  int group_local;
  FMultiBlockLinesIterator *this_local;
  
  local_28._20_4_ = group;
  pFStack_10 = this;
  FDisplacementTable::getOffset(&local_28,0x1af5e78,(int)this->basegroup);
  TVector2<double>::operator=(&this->offset,(TVector2<double> *)&local_28);
  (this->offset).X = (this->checkpoint).X + (this->offset).X;
  (this->offset).Y = (this->checkpoint).Y + (this->offset).Y;
  if (local_28._20_4_ == this->startsector->PortalGroup) {
    local_38 = this->startsector;
  }
  else {
    local_38 = P_PointInSector(&this->offset);
  }
  this->cursector = local_38;
  FBoundingBox::setBox(&this->bbox,(this->offset).X,(this->offset).Y,(this->checkpoint).Z);
  FBlockLinesIterator::init(&this->blockIterator,(EVP_PKEY_CTX *)&this->bbox);
  return;
}

Assistant:

void FMultiBlockLinesIterator::startIteratorForGroup(int group)
{
	offset = Displacements.getOffset(basegroup, group);
	offset.X += checkpoint.X;
	offset.Y += checkpoint.Y;
	cursector = group == startsector->PortalGroup ? startsector : P_PointInSector(offset);
	bbox.setBox(offset.X, offset.Y, checkpoint.Z);
	blockIterator.init(bbox);
}